

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuAstcUtil.cpp
# Opt level: O2

void tcu::astc::generateBlockCaseTestData
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *dst,
               CompressedTexFormat format,BlockTestType testType)

{
  ulong uVar1;
  undefined4 uVar2;
  ISEParams *pIVar3;
  bool bVar4;
  bool bVar5;
  deFloat16 dVar6;
  deFloat16 dVar7;
  deFloat16 dVar8;
  deFloat16 dVar9;
  int i;
  ISEMode IVar10;
  uint uVar11;
  ISEParams IVar12;
  ulong uVar13;
  int weightNdx;
  uint *puVar14;
  NormalBlockISEInputs *pNVar15;
  long lVar16;
  int blockHeight;
  int blockHeight_00;
  int blockHeight_01;
  deUint32 dVar17;
  int blockHeight_02;
  int blockHeight_03;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  ulong extraout_RDX_03;
  ulong extraout_RDX_04;
  int blockNdx_4;
  int iVar18;
  ulong uVar19;
  long lVar20;
  int numPartitions;
  int iVar21;
  uint uVar22;
  deUint32 dVar23;
  undefined1 *puVar24;
  ulong uVar25;
  int blockNdx;
  deUint32 dVar26;
  int iVar27;
  uint uVar28;
  int endpointPartNdx1;
  int iVar29;
  deUint32 dVar30;
  int blockNdx_1;
  NormalBlockISEInputs *pNVar31;
  ulong uVar32;
  int weightGridWidth;
  long local_cf8;
  NormalBlockParams local_ce8;
  NormalBlockISEInputs *local_cb0;
  AssignBlock128 local_ca8;
  long local_c98;
  ISEParams *local_c90;
  ulong local_c88;
  ISEParams local_c80;
  ulong local_c78;
  NormalBlockISEInputs *local_c70;
  IVec3 blockSize;
  ISEParams endpointISE;
  NormalBlockISEInputs iseInputs;
  
  getBlockPixelSize((tcu *)&blockSize,format);
  puVar14 = &switchD_00980e19::switchdataD_00a493b0;
  switch(testType) {
  case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(dst,0x20000);
    for (uVar22 = 0; uVar22 != 0x1fffe000; uVar22 = uVar22 + 0xffff) {
      uVar11 = uVar22 / 0x1fff;
      iseInputs.weight.value._4_8_ =
           (ulong)(uVar11 - 0x4000) << 0x30 |
           (CONCAT44(uVar11,(uVar11 & 0xffff) + uVar11 * 0x10000 + 0x40000000) ^ 0x800000000000) &
           0xffffffffffff;
      iseInputs.weight._0_8_ = 0xfffffffffffffdfc;
      anon_unknown_0::AssignBlock128::pushBytesToVector((AssignBlock128 *)&iseInputs,dst);
    }
    break;
  case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve(dst,0x20000);
    for (uVar22 = 0; uVar22 != 0x2000; uVar22 = uVar22 + 1) {
      dVar6 = deFloat32To16(((float)(int)uVar22 * 131008.0) / 8191.0 + -65504.0);
      dVar7 = deFloat32To16((float)((uVar22 + 0x800 & 0x1fff) * 0x1ffc0) / 8191.0 + -65504.0);
      dVar8 = deFloat32To16(((float)(int)(uVar22 ^ 0x1000) * 131008.0) / 8191.0 + -65504.0);
      dVar9 = deFloat32To16((float)((uVar22 + 0x1800 & 0x1fff) * 0x1ffc0) / 8191.0 + -65504.0);
      iseInputs.weight.value._4_8_ = CONCAT26(dVar9,CONCAT24(dVar8,CONCAT22(dVar7,dVar6)));
      iseInputs.weight._0_8_ = 0xfffffffffffffffc;
      anon_unknown_0::AssignBlock128::pushBytesToVector((AssignBlock128 *)&iseInputs,dst);
    }
    break;
  case BLOCK_TEST_TYPE_WEIGHT_GRID:
    for (iVar21 = 0; iVar21 != 2; iVar21 = iVar21 + 1) {
      for (pNVar31 = (NormalBlockISEInputs *)0x0; pNVar31 != (NormalBlockISEInputs *)0xc;
          pNVar31 = (NormalBlockISEInputs *)&(pNVar31->weight).field_0x1) {
        IVar12 = *(ISEParams *)(&(anonymous_namespace)::s_weightISEParamsCandidates + (long)pNVar31)
        ;
        pNVar15 = pNVar31;
        for (iVar27 = 2; iVar27 != 0xd; iVar27 = iVar27 + 1) {
          for (iVar29 = 2; iVar29 != 0xd; iVar29 = iVar29 + 1) {
            local_ce8.isMultiPartSingleCemMode = false;
            local_ce8.partitionSeed = 0xffffffff;
            local_ce8.colorEndpointModes[3] = 0;
            local_ce8.colorEndpointModes[1] = 0;
            local_ce8.colorEndpointModes[2] = 0;
            local_ce8.weightGridHeight = iVar29;
            local_ce8.weightGridWidth = iVar27;
            local_ce8.isDualPlane = SUB41(iVar21,0);
            local_ce8.ccs = 0;
            local_ce8.numPartitions = 1;
            local_ce8.colorEndpointModes[0] = 0;
            local_ce8.weightISEParams = IVar12;
            bVar4 = anon_unknown_0::isValidBlockParams
                              (&local_ce8,blockSize.m_data[0],blockSize.m_data[1]);
            if (bVar4) {
              anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
              local_ca8 = anon_unknown_0::generateNormalBlock
                                    (&local_ce8,(int)&iseInputs,blockHeight,pNVar15);
              anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
            }
          }
        }
      }
    }
    break;
  case BLOCK_TEST_TYPE_WEIGHT_ISE:
    for (local_c88 = 0; local_c88 != 0xc; local_c88 = local_c88 + 1) {
      local_ce8.isMultiPartSingleCemMode = false;
      local_ce8.partitionSeed = 0xffffffff;
      local_ce8.colorEndpointModes[3] = 0;
      local_c90 = (ISEParams *)(&(anonymous_namespace)::s_weightISEParamsCandidates + local_c88);
      local_ce8.colorEndpointModes[1] = 0;
      local_ce8.colorEndpointModes[2] = 0;
      local_ce8.weightGridWidth = 4;
      local_ce8.weightGridHeight = 4;
      local_ce8.weightISEParams = *local_c90;
      local_ce8.isDualPlane = true;
      local_ce8.ccs = 0;
      local_ce8.numPartitions = 1;
      local_ce8.colorEndpointModes[0] = 0;
      local_c98 = CONCAT44(local_c98._4_4_,blockSize.m_data[0]);
      local_cb0._0_4_ = blockSize.m_data[1];
      local_cf8 = 0x20;
      lVar16 = -0xe;
      pNVar31 = (NormalBlockISEInputs *)0x20;
      iVar21 = -0xe;
      iVar27 = 8;
      iVar29 = 4;
      local_c80 = local_ce8.weightISEParams;
      while( true ) {
        bVar4 = anon_unknown_0::isValidBlockParams(&local_ce8,(deUint32)local_c98,(int)local_cb0);
        if (bVar4) break;
        iVar29 = iVar29 + -1;
        local_ce8.weightGridHeight = iVar29;
        local_ce8.weightGridWidth = iVar29;
        iVar27 = iVar27 + -2;
        pNVar31 = (NormalBlockISEInputs *)(ulong)(uint)((int)pNVar31 + iVar21);
        iVar21 = iVar21 + 4;
        local_cf8 = local_cf8 + lVar16;
        lVar16 = lVar16 + 4;
      }
      IVar10 = local_c80.mode;
      iVar21 = (IVar10 == ISEMODE_QUINT) + 1 + (uint)(IVar10 == ISEMODE_QUINT);
      if (IVar10 == ISEMODE_TRIT) {
        iVar21 = 5;
      }
      local_cb0 = (NormalBlockISEInputs *)CONCAT44(local_cb0._4_4_,iVar21);
      iVar27 = iVar27 * iVar29;
      dVar30 = anon_unknown_0::computeISERangeMax(local_c90);
      iVar29 = dVar30 + 1;
      local_c90 = (ISEParams *)CONCAT44(local_c90._4_4_,iVar27);
      iVar21 = (iVar29 / iVar27 + 1) - (uint)(iVar29 % iVar27 == 0);
      anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
      iseInputs.weight._0_8_ = iseInputs.weight._0_8_ & 0xffffffffffffff00;
      if (iVar21 < 1) {
        iVar21 = 0;
      }
      if ((int)pNVar31 < 1) {
        pNVar31 = (NormalBlockISEInputs *)0x0;
      }
      lVar16 = 0;
      uVar32 = extraout_RDX;
      while ((int)lVar16 != (int)local_cb0) {
        local_c98 = lVar16;
        for (iVar27 = 0; iVar27 != iVar21; iVar27 = iVar27 + 1) {
          for (pNVar15 = (NormalBlockISEInputs *)0x0; pNVar31 != pNVar15;
              pNVar15 = (NormalBlockISEInputs *)&(pNVar15->weight).field_0x1) {
            uVar13 = (long)((int)pNVar15 + (int)lVar16) % (long)iVar29;
            uVar32 = uVar13 & 0xffffffff;
            *(int *)((long)&iseInputs.weight.value + (long)pNVar15 * 4) = (int)uVar13;
          }
          local_ca8 = anon_unknown_0::generateNormalBlock
                                (&local_ce8,(int)&iseInputs,(int)uVar32,pNVar15);
          anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
          lVar16 = lVar16 + local_cf8;
          uVar32 = extraout_RDX_00;
        }
        lVar16 = local_c98 + 1;
      }
      IVar10 = local_c80.mode;
      if (IVar10 < ISEMODE_PLAIN_BIT) {
        anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
        iseInputs.weight.isGivenInBlockForm = true;
        uVar11 = (uint)(IVar10 == ISEMODE_TRIT) * 0x80 + 0x80;
        uVar22 = ((int)(deUint32)local_c90 / (int)local_cb0 + 1) -
                 (uint)((int)(deUint32)local_c90 % (int)local_cb0 == 0);
        uVar32 = (long)(ulong)uVar11 % (long)(int)uVar22;
        uVar13 = uVar32 & 0xffffffff;
        iVar27 = 0;
        iVar21 = ((int)((long)(ulong)uVar11 / (long)(int)uVar22) + 1) - (uint)((int)uVar32 == 0);
        local_c98 = CONCAT44(local_c98._4_4_,uVar22);
        uVar32 = 0;
        if (0 < (int)uVar22) {
          uVar32 = (ulong)uVar22;
        }
        if (iVar21 < 1) {
          iVar21 = iVar27;
        }
        uVar19 = (ulong)local_cb0 & 0xffffffff;
        for (; iVar27 != (int)local_cb0; iVar27 = iVar27 + 1) {
          for (iVar29 = 0; iVar29 != iVar21; iVar29 = iVar29 + 1) {
            uVar22 = iVar29 * (deUint32)local_c98 + iVar27;
            puVar24 = (undefined1 *)((long)&iseInputs.weight.value + 4);
            for (uVar25 = 0; uVar25 != uVar32; uVar25 = uVar25 + 1) {
              for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
                *(undefined4 *)(puVar24 + uVar13 * 4) = 0;
              }
              uVar1 = (long)(int)(uVar22 + (int)uVar25) % (long)(int)uVar11;
              uVar13 = uVar1 & 0xffffffff;
              *(int *)((long)&iseInputs.weight.value + uVar25 * 0x18) = (int)uVar1;
              puVar24 = puVar24 + 0x18;
            }
            local_ca8 = anon_unknown_0::generateNormalBlock
                                  (&local_ce8,(int)&iseInputs,(int)uVar13,
                                   (NormalBlockISEInputs *)(ulong)uVar22);
            anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
            uVar13 = extraout_RDX_01;
          }
        }
      }
    }
    break;
  case BLOCK_TEST_TYPE_CEMS:
    for (uVar32 = 0; (int)uVar32 != 2; uVar32 = (ulong)((int)uVar32 + 1)) {
      local_c70 = (NormalBlockISEInputs *)((ulong)((int)uVar32 == 0) + 4);
      local_cb0 = (NormalBlockISEInputs *)0x1;
      local_c88 = uVar32;
      while (local_cb0 != local_c70) {
        local_c78 = CONCAT44(local_c78._4_4_,1);
        if ((NormalBlockISEInputs *)0x1 < local_cb0) {
          for (dVar30 = 0; iVar27 = blockSize.m_data[1], iVar21 = blockSize.m_data[0],
              dVar30 != 0x10; dVar30 = dVar30 + 1) {
            local_ce8.colorEndpointModes[3] = 0;
            local_ce8.colorEndpointModes[1] = 0;
            local_ce8.colorEndpointModes[2] = 0;
            local_ce8.weightGridWidth = 4;
            local_ce8.weightGridHeight = 4;
            local_ce8.isDualPlane = SUB81(uVar32,0);
            local_ce8._20_8_ = (long)local_cb0 << 0x20;
            local_ce8.isMultiPartSingleCemMode = true;
            local_ce8.partitionSeed = 0x27a;
            lVar16 = 0;
            pNVar31 = local_cb0;
            local_ce8.colorEndpointModes[0] = dVar30;
            do {
              if (lVar16 == 0x60) goto LAB_009816a3;
              local_ce8.weightISEParams =
                   *(ISEParams *)
                    ((long)&(anonymous_namespace)::s_weightISEParamsCandidates + lVar16);
              bVar4 = anon_unknown_0::isValidBlockParams(&local_ce8,iVar21,iVar27);
              lVar16 = lVar16 + 8;
            } while (!bVar4);
            anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
            local_ca8 = anon_unknown_0::generateNormalBlock
                                  (&local_ce8,(int)&iseInputs,blockHeight_00,pNVar31);
            anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
LAB_009816a3:
          }
          local_c78 = CONCAT44(local_c78._4_4_,0x10);
        }
        dVar30 = 1;
        if ((NormalBlockISEInputs *)0x3 < local_cb0) {
          dVar30 = 0x10;
        }
        uVar2 = 1;
        if ((NormalBlockISEInputs *)0x2 < local_cb0) {
          uVar2 = 0x10;
        }
        local_c90 = (ISEParams *)CONCAT44(local_c90._4_4_,uVar2);
        local_c80 = (ISEParams)(local_ce8.colorEndpointModes + (long)local_cb0);
        pNVar31 = local_cb0;
        for (local_ce8.colorEndpointModes[0] = 0; local_ce8.colorEndpointModes[0] != 0x10;
            local_ce8.colorEndpointModes[0] = local_ce8.colorEndpointModes[0] + 1) {
          local_c98 = CONCAT44(local_c98._4_4_,local_ce8.colorEndpointModes[0]);
          for (dVar17 = 0; dVar17 != (uint)local_c78; dVar17 = dVar17 + 1) {
            for (dVar23 = 0; dVar23 != (deUint32)local_c90; dVar23 = dVar23 + 1) {
              for (dVar26 = 0; IVar12 = local_c80, dVar26 != dVar30; dVar26 = dVar26 + 1) {
                local_ce8.weightGridWidth = 4;
                local_ce8.weightGridHeight = 4;
                local_ce8.weightISEParams.mode = ISEMODE_LAST;
                local_ce8.weightISEParams.numBits = -1;
                local_ce8.isDualPlane = SUB81(uVar32,0);
                local_ce8._20_8_ = (long)pNVar31 << 0x20;
                local_ce8.isMultiPartSingleCemMode = false;
                local_ce8.colorEndpointModes[2] = dVar23;
                local_ce8.colorEndpointModes[1] = dVar17;
                local_ce8.partitionSeed = 0x27a;
                local_ce8.colorEndpointModes[3] = dVar26;
                puVar14 = std::__min_element<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                                    (local_ce8.colorEndpointModes,local_c80);
                uVar22 = *puVar14;
                puVar14 = std::__max_element<unsigned_int*,__gnu_cxx::__ops::_Iter_less_iter>
                                    (local_ce8.colorEndpointModes,IVar12);
                iVar27 = blockSize.m_data[1];
                iVar21 = blockSize.m_data[0];
                if ((*puVar14 >> 2) - (uVar22 >> 2) < 2) {
                  lVar16 = 0;
                  do {
                    if (lVar16 == 0x60) goto LAB_00981803;
                    local_ce8.weightISEParams =
                         *(ISEParams *)
                          ((long)&(anonymous_namespace)::s_weightISEParamsCandidates + lVar16);
                    bVar4 = anon_unknown_0::isValidBlockParams(&local_ce8,iVar21,iVar27);
                    lVar16 = lVar16 + 8;
                  } while (!bVar4);
                  anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
                  local_ca8 = anon_unknown_0::generateNormalBlock
                                        (&local_ce8,(int)&iseInputs,blockHeight_01,pNVar31);
                  anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
                }
LAB_00981803:
                pNVar31 = local_cb0;
                uVar32 = local_c88;
                local_ce8.colorEndpointModes[0] = (deUint32)local_c98;
              }
            }
          }
        }
        local_cb0 = (NormalBlockISEInputs *)&(pNVar31->weight).field_0x1;
      }
    }
    break;
  case BLOCK_TEST_TYPE_PARTITION_SEED:
    for (iVar21 = 2; iVar21 != 5; iVar21 = iVar21 + 1) {
      for (dVar30 = 0; dVar30 != 0x400; dVar30 = dVar30 + 1) {
        local_ce8.colorEndpointModes[3] = 0;
        local_ce8.colorEndpointModes[1] = 0;
        local_ce8.colorEndpointModes[2] = 0;
        local_ce8.weightGridWidth = 4;
        local_ce8.weightGridHeight = 4;
        local_ce8.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        local_ce8.weightISEParams.numBits = 2;
        local_ce8.isDualPlane = false;
        local_ce8.numPartitions = iVar21;
        local_ce8.ccs = 0xffffffff;
        local_ce8.isMultiPartSingleCemMode = true;
        local_ce8.colorEndpointModes[0] = 0;
        local_ce8.partitionSeed = dVar30;
        anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
        local_ca8 = anon_unknown_0::generateNormalBlock
                              (&local_ce8,(int)&iseInputs,blockHeight_02,
                               (NormalBlockISEInputs *)puVar14);
        anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
      }
    }
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
  case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
    local_c70 = (NormalBlockISEInputs *)CONCAT44(local_c70._4_4_,testType);
    for (uVar22 = 0; uVar22 != 0x10; uVar22 = uVar22 + 1) {
      uVar11 = uVar22 & 0xe;
      if ((testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR) ||
         (uVar11 != 0xe && ((uVar22 != 0xb && uVar22 != 7) && uVar11 != 2))) {
        if ((testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15 || uVar22 == 0xf) &&
           (testType != BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15 ||
            uVar22 != 0xf && (uVar11 == 0xe || ((uVar22 == 0xb || uVar22 == 7) || uVar11 == 2)))) {
          local_ce8.isMultiPartSingleCemMode = false;
          local_ce8.partitionSeed = 0xffffffff;
          local_ce8.colorEndpointModes[3] = 0;
          local_ce8.colorEndpointModes[1] = 0;
          local_ce8.colorEndpointModes[2] = 0;
          local_ce8.weightGridWidth = 3;
          local_ce8.weightGridHeight = 4;
          local_ce8.weightISEParams.mode = ISEMODE_PLAIN_BIT;
          local_ce8.weightISEParams.numBits = 2;
          local_ce8.isDualPlane = false;
          local_ce8.ccs = 0xffffffff;
          local_ce8.numPartitions = 1;
          local_ce8.colorEndpointModes[0] = uVar22;
          iVar21 = anon_unknown_0::computeNumBitsForColorEndpoints(&local_ce8);
          local_c78 = CONCAT44(local_c78._4_4_,uVar22);
          uVar22 = (uVar22 >> 1 & 6) + 2;
          local_c88 = (ulong)uVar22;
          endpointISE = anon_unknown_0::computeMaximumRangeISEParams(iVar21,uVar22);
          dVar30 = anon_unknown_0::computeISERangeMax(&endpointISE);
          local_c80 = (ISEParams)(ulong)(dVar30 + 1);
          if (9 < (int)(dVar30 + 1)) {
            local_c80 = (ISEParams)0xa;
          }
          iVar21 = SUB84(local_c80,0);
          iVar29 = iVar21 + -1;
          iVar27 = 0;
          if (0 < iVar21) {
            iVar27 = iVar21;
          }
          local_cb0 = (NormalBlockISEInputs *)CONCAT44(local_cb0._4_4_,iVar27);
          uVar32 = 1;
          for (uVar13 = 0; pIVar3 = (ISEParams *)uVar32, uVar13 < local_c88; uVar13 = uVar13 + 1) {
            for (; local_c90 = pIVar3, uVar32 < local_c88; uVar32 = uVar32 + 1) {
              anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
              iVar21 = 0;
              while (iVar21 != (int)local_cb0) {
                local_c98 = CONCAT44(local_c98._4_4_,iVar21);
                iVar27 = 0;
                uVar19 = (ulong)local_c80 & 0xffffffff;
                while (iVar18 = (int)uVar19, uVar19 = (ulong)(iVar18 - 1), iVar18 != 0) {
                  uVar25 = (long)(int)(iVar21 * dVar30) / (long)iVar29;
                  *(int *)((long)&iseInputs.endpoint.value + uVar13 * 4) = (int)uVar25;
                  *(int *)((long)&iseInputs.endpoint.value + uVar32 * 4) = iVar27 / iVar29;
                  local_ca8 = anon_unknown_0::generateNormalBlock
                                        (&local_ce8,(int)&iseInputs,iVar27 % iVar29,
                                         (NormalBlockISEInputs *)(uVar25 & 0xffffffff));
                  anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
                  iVar27 = iVar27 + dVar30;
                }
                iVar21 = (deUint32)local_c98 + 1;
              }
              pIVar3 = local_c90;
            }
            uVar32 = (long)local_c90 + 1;
          }
          uVar22 = (uint)local_c78;
          testType = (BlockTestType)local_c70;
        }
      }
    }
    break;
  case BLOCK_TEST_TYPE_ENDPOINT_ISE:
    for (lVar16 = 0; lVar16 != 0xb; lVar16 = lVar16 + 1) {
      bVar4 = false;
      for (uVar32 = 1; (!bVar4 && (uVar22 = (uint)uVar32, uVar22 < 5));
          uVar32 = (ulong)((int)uVar32 + 1)) {
        local_c70 = (NormalBlockISEInputs *)((ulong)local_c70 & 0xffffffff00000000);
        local_c88 = uVar32;
        while ((!bVar4 && ((BlockTestType)local_c70 < 2))) {
          for (local_c78 = 0; (!bVar4 && (local_c78 < 0xc)); local_c78 = local_c78 + 1) {
            local_c90 = (ISEParams *)CONCAT44(local_c90._4_4_,2);
            while ((!bVar4 && ((deUint32)local_c90 < 0xd))) {
              uVar11 = 2;
              while( true ) {
                if ((bVar4) || (0xc < uVar11)) break;
                local_ce8.colorEndpointModes[3] = 0;
                local_ce8.colorEndpointModes[1] = 0;
                local_ce8.colorEndpointModes[2] = 0;
                local_c80.mode = uVar11;
                local_ce8.weightGridHeight = uVar11;
                local_ce8.weightGridWidth = (deUint32)local_c90;
                local_ce8.weightISEParams =
                     *(ISEParams *)(&(anonymous_namespace)::s_weightISEParamsCandidates + local_c78)
                ;
                local_ce8.isDualPlane = SUB81(local_c70,0);
                local_ce8._20_8_ = uVar32 << 0x20;
                local_ce8.isMultiPartSingleCemMode = true;
                local_ce8.colorEndpointModes[0] = 0xc;
                local_ce8.partitionSeed = 0x27a;
                bVar5 = anon_unknown_0::isValidBlockParams
                                  (&local_ce8,blockSize.m_data[0],blockSize.m_data[1]);
                if (bVar5) {
                  iVar21 = anon_unknown_0::computeNumBitsForColorEndpoints(&local_ce8);
                  IVar12 = anon_unknown_0::computeMaximumRangeISEParams(iVar21,uVar22 * 8);
                  endpointISE = IVar12;
                  dVar30 = anon_unknown_0::computeISERangeMax(&endpointISE);
                  if (dVar30 == generateBlockCaseTestData::endpointRangeMaximums[lVar16]) {
                    uVar11 = anon_unknown_0::computeNumColorEndpointValues
                                       (local_ce8.colorEndpointModes,(int)local_c88,true);
                    IVar10 = IVar12.mode;
                    iVar21 = (uint)(IVar10 == ISEMODE_QUINT) * 2 + 1;
                    if (IVar10 == ISEMODE_TRIT) {
                      iVar21 = 5;
                    }
                    local_cb0 = (NormalBlockISEInputs *)CONCAT44(local_cb0._4_4_,iVar21);
                    iVar27 = dVar30 + 1;
                    iVar21 = (iVar27 / (int)uVar11 + 1) - (uint)(iVar27 % (int)uVar11 == 0);
                    anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
                    iseInputs.endpoint.isGivenInBlockForm = false;
                    pNVar31 = (NormalBlockISEInputs *)0x0;
                    if (0 < (int)uVar11) {
                      pNVar31 = (NormalBlockISEInputs *)(ulong)uVar11;
                    }
                    if (iVar21 < 1) {
                      iVar21 = 0;
                    }
                    lVar20 = 0;
                    uVar32 = extraout_RDX_02;
                    while ((int)lVar20 != (int)local_cb0) {
                      local_c98 = lVar20;
                      for (iVar29 = 0; iVar29 != iVar21; iVar29 = iVar29 + 1) {
                        for (pNVar15 = (NormalBlockISEInputs *)0x0; pNVar31 != pNVar15;
                            pNVar15 = (NormalBlockISEInputs *)&(pNVar15->weight).field_0x1) {
                          uVar13 = (long)((int)lVar20 + (int)pNVar15) % (long)iVar27;
                          uVar32 = uVar13 & 0xffffffff;
                          *(int *)((long)&iseInputs.endpoint.value + (long)pNVar15 * 4) =
                               (int)uVar13;
                        }
                        local_ca8 = anon_unknown_0::generateNormalBlock
                                              (&local_ce8,(int)&iseInputs,(int)uVar32,pNVar15);
                        anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
                        lVar20 = lVar20 + (ulong)uVar11;
                        uVar32 = extraout_RDX_03;
                      }
                      lVar20 = local_c98 + 1;
                    }
                    bVar4 = true;
                    if (IVar10 < ISEMODE_PLAIN_BIT) {
                      anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
                      iseInputs.endpoint.isGivenInBlockForm = true;
                      uVar28 = (uint)(IVar10 == ISEMODE_TRIT) * 0x80 + 0x80;
                      uVar11 = ((int)uVar11 / (int)local_cb0 + 1) -
                               (uint)((int)uVar11 % (int)local_cb0 == 0);
                      uVar32 = (long)(ulong)uVar28 % (long)(int)uVar11;
                      uVar13 = uVar32 & 0xffffffff;
                      iVar27 = 0;
                      iVar21 = ((int)((long)(ulong)uVar28 / (long)(int)uVar11) + 1) -
                               (uint)((int)uVar32 == 0);
                      local_c98 = CONCAT44(local_c98._4_4_,uVar11);
                      uVar32 = 0;
                      if (0 < (int)uVar11) {
                        uVar32 = (ulong)uVar11;
                      }
                      if (iVar21 < 1) {
                        iVar21 = iVar27;
                      }
                      uVar19 = (ulong)local_cb0 & 0xffffffff;
                      for (; iVar27 != (int)local_cb0; iVar27 = iVar27 + 1) {
                        for (iVar29 = 0; iVar29 != iVar21; iVar29 = iVar29 + 1) {
                          uVar11 = iVar29 * (deUint32)local_c98 + iVar27;
                          puVar24 = (undefined1 *)((long)&iseInputs.endpoint.value + 4);
                          for (uVar25 = 0; uVar25 != uVar32; uVar25 = uVar25 + 1) {
                            for (uVar13 = 0; uVar19 != uVar13; uVar13 = uVar13 + 1) {
                              *(undefined4 *)(puVar24 + uVar13 * 4) = 0;
                            }
                            uVar1 = (long)(int)(uVar11 + (int)uVar25) % (long)(int)uVar28;
                            uVar13 = uVar1 & 0xffffffff;
                            *(int *)((long)&iseInputs.endpoint.value + uVar25 * 0x18) = (int)uVar1;
                            puVar24 = puVar24 + 0x18;
                          }
                          local_ca8 = anon_unknown_0::generateNormalBlock
                                                (&local_ce8,(int)&iseInputs,(int)uVar13,
                                                 (NormalBlockISEInputs *)(ulong)uVar11);
                          anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
                          uVar13 = extraout_RDX_04;
                        }
                      }
                      bVar4 = true;
                    }
                  }
                }
                uVar11 = local_c80.mode + 1;
                uVar32 = local_c88;
              }
              local_c90 = (ISEParams *)CONCAT44(local_c90._4_4_,(deUint32)local_c90 + 1);
            }
          }
          local_c70 = (NormalBlockISEInputs *)CONCAT44(local_c70._4_4_,(BlockTestType)local_c70 + 1)
          ;
        }
      }
    }
    break;
  case BLOCK_TEST_TYPE_CCS:
    for (iVar21 = 1; iVar21 != 4; iVar21 = iVar21 + 1) {
      for (dVar30 = 0; dVar30 != 4; dVar30 = dVar30 + 1) {
        local_ce8.colorEndpointModes[3] = 0;
        local_ce8.colorEndpointModes[1] = 0;
        local_ce8.colorEndpointModes[2] = 0;
        local_ce8.weightGridWidth = 3;
        local_ce8.weightGridHeight = 3;
        local_ce8.weightISEParams.mode = ISEMODE_PLAIN_BIT;
        local_ce8.weightISEParams.numBits = 2;
        local_ce8.isDualPlane = true;
        local_ce8.numPartitions = iVar21;
        local_ce8.ccs = dVar30;
        local_ce8.isMultiPartSingleCemMode = true;
        local_ce8.colorEndpointModes[0] = 8;
        local_ce8.partitionSeed = 0x27a;
        anon_unknown_0::generateDefaultISEInputs(&iseInputs,&local_ce8);
        local_ca8 = anon_unknown_0::generateNormalBlock
                              (&local_ce8,(int)&iseInputs,blockHeight_03,
                               (NormalBlockISEInputs *)puVar14);
        anon_unknown_0::AssignBlock128::pushBytesToVector(&local_ca8,dst);
      }
    }
    break;
  case BLOCK_TEST_TYPE_RANDOM:
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(dst,0x40000);
    generateRandomBlocks
              ((dst->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start,0x4000,format,1);
  }
  return;
}

Assistant:

void generateBlockCaseTestData (vector<deUint8>& dst, CompressedTexFormat format, BlockTestType testType)
{
	DE_ASSERT(isAstcFormat(format));
	DE_ASSERT(!(isAstcSRGBFormat(format) && isBlockTestTypeHDROnly(testType)));

	const IVec3 blockSize = getBlockPixelSize(format);
	DE_ASSERT(blockSize.z() == 1);

	switch (testType)
	{
		case BLOCK_TEST_TYPE_VOID_EXTENT_LDR:
		// Generate a gradient-like set of LDR void-extent blocks.
		{
			const int			numBlocks	= 1<<13;
			const deUint32		numValues	= 1<<16;
			dst.reserve(numBlocks*BLOCK_SIZE_BYTES);

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const deUint32 baseValue	= blockNdx*(numValues-1) / (numBlocks-1);
				const deUint16 r			= (deUint16)((baseValue + numValues*0/4) % numValues);
				const deUint16 g			= (deUint16)((baseValue + numValues*1/4) % numValues);
				const deUint16 b			= (deUint16)((baseValue + numValues*2/4) % numValues);
				const deUint16 a			= (deUint16)((baseValue + numValues*3/4) % numValues);
				AssignBlock128 block;

				generateVoidExtentBlock(VoidExtentParams(false, r, g, b, a)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_VOID_EXTENT_HDR:
		// Generate a gradient-like set of HDR void-extent blocks, with values ranging from the largest finite negative to largest finite positive of fp16.
		{
			const float		minValue	= -65504.0f;
			const float		maxValue	= +65504.0f;
			const int		numBlocks	= 1<<13;
			dst.reserve(numBlocks*BLOCK_SIZE_BYTES);

			for (int blockNdx = 0; blockNdx < numBlocks; blockNdx++)
			{
				const int			rNdx	= (blockNdx + numBlocks*0/4) % numBlocks;
				const int			gNdx	= (blockNdx + numBlocks*1/4) % numBlocks;
				const int			bNdx	= (blockNdx + numBlocks*2/4) % numBlocks;
				const int			aNdx	= (blockNdx + numBlocks*3/4) % numBlocks;
				const deFloat16		r		= deFloat32To16(minValue + (float)rNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		g		= deFloat32To16(minValue + (float)gNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		b		= deFloat32To16(minValue + (float)bNdx * (maxValue - minValue) / (float)(numBlocks-1));
				const deFloat16		a		= deFloat32To16(minValue + (float)aNdx * (maxValue - minValue) / (float)(numBlocks-1));

				generateVoidExtentBlock(VoidExtentParams(true, r, g, b, a)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_WEIGHT_GRID:
		// Generate different combinations of plane count, weight ISE params, and grid size.
		{
			for (int isDualPlane = 0;		isDualPlane <= 1;												isDualPlane++)
			for (int iseParamsNdx = 0;		iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	iseParamsNdx++)
			for (int weightGridWidth = 2;	weightGridWidth <= 12;											weightGridWidth++)
			for (int weightGridHeight = 2;	weightGridHeight <= 12;											weightGridHeight++)
			{
				NormalBlockParams		blockParams;
				NormalBlockISEInputs	iseInputs;

				blockParams.weightGridWidth			= weightGridWidth;
				blockParams.weightGridHeight		= weightGridHeight;
				blockParams.isDualPlane				= isDualPlane != 0;
				blockParams.weightISEParams			= s_weightISEParamsCandidates[iseParamsNdx];
				blockParams.ccs						= 0;
				blockParams.numPartitions			= 1;
				blockParams.colorEndpointModes[0]	= 0;

				if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
					generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_WEIGHT_ISE:
		// For each weight ISE param set, generate blocks that cover:
		// - each single value of the ISE's range, at each position inside an ISE block
		// - for trit and quint ISEs, each single T or Q value of an ISE block
		{
			for (int iseParamsNdx = 0;	iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	iseParamsNdx++)
			{
				const ISEParams&	iseParams = s_weightISEParamsCandidates[iseParamsNdx];
				NormalBlockParams	blockParams;

				blockParams.weightGridWidth			= 4;
				blockParams.weightGridHeight		= 4;
				blockParams.weightISEParams			= iseParams;
				blockParams.numPartitions			= 1;
				blockParams.isDualPlane				= blockParams.weightGridWidth * blockParams.weightGridHeight < 24 ? true : false;
				blockParams.ccs						= 0;
				blockParams.colorEndpointModes[0]	= 0;

				while (!isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
				{
					blockParams.weightGridWidth--;
					blockParams.weightGridHeight--;
				}

				const int numValuesInISEBlock	= iseParams.mode == ISEMODE_TRIT ? 5 : iseParams.mode == ISEMODE_QUINT ? 3 : 1;
				const int numWeights			= computeNumWeights(blockParams);

				{
					const int				numWeightValues		= (int)computeISERangeMax(iseParams) + 1;
					const int				numBlocks			= deDivRoundUp32(numWeightValues, numWeights);
					NormalBlockISEInputs	iseInputs			= generateDefaultISEInputs(blockParams);
					iseInputs.weight.isGivenInBlockForm = false;

					for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
					for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
					{
						for (int weightNdx = 0; weightNdx < numWeights; weightNdx++)
							iseInputs.weight.value.plain[weightNdx] = (blockNdx*numWeights + weightNdx + offset) % numWeightValues;

						generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
					}
				}

				if (iseParams.mode == ISEMODE_TRIT || iseParams.mode == ISEMODE_QUINT)
				{
					NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
					iseInputs.weight.isGivenInBlockForm = true;

					const int numTQValues			= 1 << (iseParams.mode == ISEMODE_TRIT ? 8 : 7);
					const int numISEBlocksPerBlock	= deDivRoundUp32(numWeights, numValuesInISEBlock);
					const int numBlocks				= deDivRoundUp32(numTQValues, numISEBlocksPerBlock);

					for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
					for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
					{
						for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocksPerBlock; iseBlockNdx++)
						{
							for (int i = 0; i < numValuesInISEBlock; i++)
								iseInputs.weight.value.block[iseBlockNdx].bitValues[i] = 0;
							iseInputs.weight.value.block[iseBlockNdx].tOrQValue = (blockNdx*numISEBlocksPerBlock + iseBlockNdx + offset) % numTQValues;
						}

						generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_CEMS:
		// For each plane count & partition count combination, generate all color endpoint mode combinations.
		{
			for (int isDualPlane = 0;		isDualPlane <= 1;								isDualPlane++)
			for (int numPartitions = 1;		numPartitions <= (isDualPlane != 0 ? 3 : 4);	numPartitions++)
			{
				// Multi-partition, single-CEM mode.
				if (numPartitions > 1)
				{
					for (deUint32 singleCem = 0; singleCem < 16; singleCem++)
					{
						NormalBlockParams blockParams;
						blockParams.weightGridWidth				= 4;
						blockParams.weightGridHeight			= 4;
						blockParams.isDualPlane					= isDualPlane != 0;
						blockParams.ccs							= 0;
						blockParams.numPartitions				= numPartitions;
						blockParams.isMultiPartSingleCemMode	= true;
						blockParams.colorEndpointModes[0]		= singleCem;
						blockParams.partitionSeed				= 634;

						for (int iseParamsNdx = 0; iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates); iseParamsNdx++)
						{
							blockParams.weightISEParams = s_weightISEParamsCandidates[iseParamsNdx];
							if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
							{
								generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
								break;
							}
						}
					}
				}

				// Separate-CEM mode.
				for (deUint32 cem0 = 0; cem0 < 16; cem0++)
				for (deUint32 cem1 = 0; cem1 < (numPartitions >= 2 ? 16u : 1u); cem1++)
				for (deUint32 cem2 = 0; cem2 < (numPartitions >= 3 ? 16u : 1u); cem2++)
				for (deUint32 cem3 = 0; cem3 < (numPartitions >= 4 ? 16u : 1u); cem3++)
				{
					NormalBlockParams blockParams;
					blockParams.weightGridWidth				= 4;
					blockParams.weightGridHeight			= 4;
					blockParams.isDualPlane					= isDualPlane != 0;
					blockParams.ccs							= 0;
					blockParams.numPartitions				= numPartitions;
					blockParams.isMultiPartSingleCemMode	= false;
					blockParams.colorEndpointModes[0]		= cem0;
					blockParams.colorEndpointModes[1]		= cem1;
					blockParams.colorEndpointModes[2]		= cem2;
					blockParams.colorEndpointModes[3]		= cem3;
					blockParams.partitionSeed				= 634;

					{
						const deUint32 minCem		= *std::min_element(&blockParams.colorEndpointModes[0], &blockParams.colorEndpointModes[numPartitions]);
						const deUint32 maxCem		= *std::max_element(&blockParams.colorEndpointModes[0], &blockParams.colorEndpointModes[numPartitions]);
						const deUint32 minCemClass	= minCem/4;
						const deUint32 maxCemClass	= maxCem/4;

						if (maxCemClass - minCemClass > 1)
							continue;
					}

					for (int iseParamsNdx = 0; iseParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates); iseParamsNdx++)
					{
						blockParams.weightISEParams = s_weightISEParamsCandidates[iseParamsNdx];
						if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
						{
							generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
							break;
						}
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_PARTITION_SEED:
		// Test all partition seeds ("partition pattern indices").
		{
			for (int		numPartitions = 2;	numPartitions <= 4;		numPartitions++)
			for (deUint32	partitionSeed = 0;	partitionSeed < 1<<10;	partitionSeed++)
			{
				NormalBlockParams blockParams;
				blockParams.weightGridWidth				= 4;
				blockParams.weightGridHeight			= 4;
				blockParams.weightISEParams				= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane					= false;
				blockParams.numPartitions				= numPartitions;
				blockParams.isMultiPartSingleCemMode	= true;
				blockParams.colorEndpointModes[0]		= 0;
				blockParams.partitionSeed				= partitionSeed;

				generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		// \note Fall-through.
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR:
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15:
		case BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15:
		// For each endpoint mode, for each pair of components in the endpoint value, test 10x10 combinations of values for that pair.
		// \note Separate modes for HDR and mode 15 due to different color scales and biases.
		{
			for (deUint32 cem = 0; cem < 16; cem++)
			{
				const bool isHDRCem = cem == 2		||
									  cem == 3		||
									  cem == 7		||
									  cem == 11		||
									  cem == 14		||
									  cem == 15;

				if ((testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_LDR			&& isHDRCem)					||
					(testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_NO_15		&& (!isHDRCem || cem == 15))	||
					(testType == BLOCK_TEST_TYPE_ENDPOINT_VALUE_HDR_15		&& cem != 15))
					continue;

				NormalBlockParams blockParams;
				blockParams.weightGridWidth			= 3;
				blockParams.weightGridHeight		= 4;
				blockParams.weightISEParams			= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane				= false;
				blockParams.numPartitions			= 1;
				blockParams.colorEndpointModes[0]	= cem;

				{
					const int			numBitsForEndpoints		= computeNumBitsForColorEndpoints(blockParams);
					const int			numEndpointParts		= computeNumColorEndpointValues(cem);
					const ISEParams		endpointISE				= computeMaximumRangeISEParams(numBitsForEndpoints, numEndpointParts);
					const int			endpointISERangeMax		= computeISERangeMax(endpointISE);

					for (int endpointPartNdx0 = 0;						endpointPartNdx0 < numEndpointParts; endpointPartNdx0++)
					for (int endpointPartNdx1 = endpointPartNdx0+1;		endpointPartNdx1 < numEndpointParts; endpointPartNdx1++)
					{
						NormalBlockISEInputs	iseInputs			= generateDefaultISEInputs(blockParams);
						const int				numEndpointValues	= de::min(10, endpointISERangeMax+1);

						for (int endpointValueNdx0 = 0; endpointValueNdx0 < numEndpointValues; endpointValueNdx0++)
						for (int endpointValueNdx1 = 0; endpointValueNdx1 < numEndpointValues; endpointValueNdx1++)
						{
							const int endpointValue0 = endpointValueNdx0 * endpointISERangeMax / (numEndpointValues-1);
							const int endpointValue1 = endpointValueNdx1 * endpointISERangeMax / (numEndpointValues-1);

							iseInputs.endpoint.value.plain[endpointPartNdx0] = endpointValue0;
							iseInputs.endpoint.value.plain[endpointPartNdx1] = endpointValue1;

							generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
						}
					}
				}
			}

			break;
		}

		case BLOCK_TEST_TYPE_ENDPOINT_ISE:
		// Similar to BLOCK_TEST_TYPE_WEIGHT_ISE, see above.
		{
			static const deUint32 endpointRangeMaximums[] = { 5, 9, 11, 19, 23, 39, 47, 79, 95, 159, 191 };

			for (int endpointRangeNdx = 0; endpointRangeNdx < DE_LENGTH_OF_ARRAY(endpointRangeMaximums); endpointRangeNdx++)
			{
				bool validCaseGenerated = false;

				for (int numPartitions = 1;			!validCaseGenerated && numPartitions <= 4;														numPartitions++)
				for (int isDual = 0;				!validCaseGenerated && isDual <= 1;																isDual++)
				for (int weightISEParamsNdx = 0;	!validCaseGenerated && weightISEParamsNdx < DE_LENGTH_OF_ARRAY(s_weightISEParamsCandidates);	weightISEParamsNdx++)
				for (int weightGridWidth = 2;		!validCaseGenerated && weightGridWidth <= 12;													weightGridWidth++)
				for (int weightGridHeight = 2;		!validCaseGenerated && weightGridHeight <= 12;													weightGridHeight++)
				{
					NormalBlockParams blockParams;
					blockParams.weightGridWidth				= weightGridWidth;
					blockParams.weightGridHeight			= weightGridHeight;
					blockParams.weightISEParams				= s_weightISEParamsCandidates[weightISEParamsNdx];
					blockParams.isDualPlane					= isDual != 0;
					blockParams.ccs							= 0;
					blockParams.numPartitions				= numPartitions;
					blockParams.isMultiPartSingleCemMode	= true;
					blockParams.colorEndpointModes[0]		= 12;
					blockParams.partitionSeed				= 634;

					if (isValidBlockParams(blockParams, blockSize.x(), blockSize.y()))
					{
						const ISEParams endpointISEParams = computeMaximumRangeISEParams(computeNumBitsForColorEndpoints(blockParams),
																						 computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], numPartitions, true));

						if (computeISERangeMax(endpointISEParams) == endpointRangeMaximums[endpointRangeNdx])
						{
							validCaseGenerated = true;

							const int numColorEndpoints		= computeNumColorEndpointValues(&blockParams.colorEndpointModes[0], numPartitions, blockParams.isMultiPartSingleCemMode);
							const int numValuesInISEBlock	= endpointISEParams.mode == ISEMODE_TRIT ? 5 : endpointISEParams.mode == ISEMODE_QUINT ? 3 : 1;

							{
								const int				numColorEndpointValues	= (int)computeISERangeMax(endpointISEParams) + 1;
								const int				numBlocks				= deDivRoundUp32(numColorEndpointValues, numColorEndpoints);
								NormalBlockISEInputs	iseInputs				= generateDefaultISEInputs(blockParams);
								iseInputs.endpoint.isGivenInBlockForm = false;

								for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
								for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
								{
									for (int endpointNdx = 0; endpointNdx < numColorEndpoints; endpointNdx++)
										iseInputs.endpoint.value.plain[endpointNdx] = (blockNdx*numColorEndpoints + endpointNdx + offset) % numColorEndpointValues;

									generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
								}
							}

							if (endpointISEParams.mode == ISEMODE_TRIT || endpointISEParams.mode == ISEMODE_QUINT)
							{
								NormalBlockISEInputs iseInputs = generateDefaultISEInputs(blockParams);
								iseInputs.endpoint.isGivenInBlockForm = true;

								const int numTQValues			= 1 << (endpointISEParams.mode == ISEMODE_TRIT ? 8 : 7);
								const int numISEBlocksPerBlock	= deDivRoundUp32(numColorEndpoints, numValuesInISEBlock);
								const int numBlocks				= deDivRoundUp32(numTQValues, numISEBlocksPerBlock);

								for (int offset = 0;	offset < numValuesInISEBlock;	offset++)
								for (int blockNdx = 0;	blockNdx < numBlocks;			blockNdx++)
								{
									for (int iseBlockNdx = 0; iseBlockNdx < numISEBlocksPerBlock; iseBlockNdx++)
									{
										for (int i = 0; i < numValuesInISEBlock; i++)
											iseInputs.endpoint.value.block[iseBlockNdx].bitValues[i] = 0;
										iseInputs.endpoint.value.block[iseBlockNdx].tOrQValue = (blockNdx*numISEBlocksPerBlock + iseBlockNdx + offset) % numTQValues;
									}

									generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), iseInputs).pushBytesToVector(dst);
								}
							}
						}
					}
				}

				DE_ASSERT(validCaseGenerated);
			}

			break;
		}

		case BLOCK_TEST_TYPE_CCS:
		// For all partition counts, test all values of the CCS (color component selector).
		{
			for (int		numPartitions = 1;		numPartitions <= 3;		numPartitions++)
			for (deUint32	ccs = 0;				ccs < 4;				ccs++)
			{
				NormalBlockParams blockParams;
				blockParams.weightGridWidth				= 3;
				blockParams.weightGridHeight			= 3;
				blockParams.weightISEParams				= ISEParams(ISEMODE_PLAIN_BIT, 2);
				blockParams.isDualPlane					= true;
				blockParams.ccs							= ccs;
				blockParams.numPartitions				= numPartitions;
				blockParams.isMultiPartSingleCemMode	= true;
				blockParams.colorEndpointModes[0]		= 8;
				blockParams.partitionSeed				= 634;

				generateNormalBlock(blockParams, blockSize.x(), blockSize.y(), generateDefaultISEInputs(blockParams)).pushBytesToVector(dst);
			}

			break;
		}

		case BLOCK_TEST_TYPE_RANDOM:
		// Generate a number of random (including invalid) blocks.
		{
			const int		numBlocks	= 16384;
			const deUint32	seed		= 1;

			dst.resize(numBlocks*BLOCK_SIZE_BYTES);

			generateRandomBlocks(&dst[0], numBlocks, format, seed);

			break;
		}

		default:
			DE_ASSERT(false);
	}
}